

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

size_t al_fwrite32le(ALLEGRO_FILE *f,int32_t l)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t b;
  uint8_t b_1;
  uint8_t b_2;
  uint8_t b_3;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  byte local_21;
  
  f->ungetc_len = 0;
  sVar1 = (*f->vtable->fi_fwrite)(f,&local_24,1);
  sVar2 = 0;
  if (sVar1 == 1) {
    f->ungetc_len = 0;
    sVar2 = 1;
    sVar1 = (*f->vtable->fi_fwrite)(f,&local_23,1);
    if (sVar1 == 1) {
      f->ungetc_len = 0;
      sVar1 = (*f->vtable->fi_fwrite)(f,&local_22,1);
      sVar2 = 2;
      if (sVar1 == 1) {
        local_21 = (byte)((uint)l >> 0x18);
        f->ungetc_len = 0;
        sVar1 = (*f->vtable->fi_fwrite)(f,&local_21,1);
        sVar2 = (ulong)((uint)l >> 0x18 == (uint)local_21 && sVar1 == 1) + 3;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t al_fwrite32le(ALLEGRO_FILE *f, int32_t l)
{
   uint8_t b1, b2, b3, b4;
   ASSERT(f);

   b1 = ((l & 0xFF000000L) >> 24);
   b2 = ((l & 0x00FF0000L) >> 16);
   b3 = ((l & 0x0000FF00L) >> 8);
   b4 = l & 0x00FF;

   if (al_fputc(f, b4) == b4) {
      if (al_fputc(f, b3) == b3) {
         if (al_fputc(f, b2) == b2) {
            if (al_fputc(f, b1) == b1) {
               return 4;
            }
            return 3;
         }
         return 2;
      }
      return 1;
   }
   return 0;
}